

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item_group.cpp
# Opt level: O2

void __thiscall mpt::item_group::clear(item_group *this)

{
  metatype *in_RSI;
  
  clear((item_group *)&this[-1]._items,in_RSI);
  return;
}

Assistant:

size_t item_group::clear(const metatype *ref)
{
	long remove = 0;
	if (!ref) {
		remove = _items.length();
		_items = item_array<metatype>();
		return remove ? true : false;
	}
	long empty = 0;
	for (auto &it : _items) {
		metatype *curr = it.instance();
		if (!curr) {
			++empty;
			continue;
		}
		if (curr != ref) {
			continue;
		}
		it.set_instance(nullptr);
		++remove;
	}
	if ((remove + empty) > _items.length()/2) {
		_items.compact();
	}
	return remove;
}